

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::HandleBadFullItem
          (cmComputeLinkInformation *this,string *item,string *file)

{
  cmake *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __position;
  ostream *poVar4;
  string *psVar5;
  PolicyID id;
  PolicyID id_00;
  string wid;
  ostringstream e;
  string local_1e8;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [376];
  
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         ((this->Depends).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->Depends).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,item);
  if (__position._M_current !=
      (this->Depends).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&this->Depends,(iterator)__position._M_current);
  }
  AddUserItem(this,file,false);
  cmOrderDirectories::AddLinkLibrary(this->OrderLinkerSearchPath,item);
  PVar3 = cmPolicies::PolicyMap::Get(&this->Target->PolicyMap,CMP0008);
  if (PVar3 - REQUIRED_IF_USED < 2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_1e8,(cmPolicies *)0x8,id);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Target \"",8);
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" links to item\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(item->_M_dataplus)._M_p,item->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"which is a full-path but not a valid library file name.",0x37);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = this->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1c8);
    cmake::IssueMessage(pcVar1,FATAL_ERROR,&local_1e8,(cmListFileBacktrace *)local_1c8);
    if ((cmMakefile *)local_1c8._8_8_ != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  }
  else if (PVar3 == WARN) {
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e8,"CMP0008-WARNING-GIVEN-","");
    std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)(item->_M_dataplus)._M_p);
    bVar2 = cmState::GetGlobalPropertyAsBool(this->CMakeInstance->State,&local_1e8);
    if (!bVar2) {
      cmState::SetGlobalProperty(this->CMakeInstance->State,&local_1e8,"1");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_1c8,(cmPolicies *)0x8,id_00);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,(char *)local_1c8._0_8_,local_1c8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Target \"",8);
      psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" links to item\n",0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(item->_M_dataplus)._M_p,item->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"which is a full-path but not a valid library file name.",0x37);
      if ((cmTarget *)local_1c8._0_8_ != (cmTarget *)local_1b8) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._0_8_ + 1));
      }
      pcVar1 = this->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1a8);
      cmake::IssueMessage(pcVar1,AUTHOR_WARNING,(string *)local_1c8,(cmListFileBacktrace *)local_1a8
                         );
      if ((cmMakefile *)local_1a8._8_8_ != (cmMakefile *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
      }
      if ((cmTarget *)local_1c8._0_8_ != (cmTarget *)local_1b8) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._0_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmComputeLinkInformation::HandleBadFullItem(std::string const& item,
                                                 std::string const& file)
{
  // Do not depend on things that do not exist.
  std::vector<std::string>::iterator i =
    std::find(this->Depends.begin(), this->Depends.end(), item);
  if (i != this->Depends.end()) {
    this->Depends.erase(i);
  }

  // Tell the linker to search for the item and provide the proper
  // path for it.  Do not contribute to any CMP0003 warning (do not
  // put in OldLinkDirItems or OldUserFlagItems).
  this->AddUserItem(file, false);
  this->OrderLinkerSearchPath->AddLinkLibrary(item);

  // Produce any needed message.
  switch (this->Target->GetPolicyStatusCMP0008()) {
    case cmPolicies::WARN: {
      // Print the warning at most once for this item.
      std::string wid = "CMP0008-WARNING-GIVEN-";
      wid += item;
      if (!this->CMakeInstance->GetState()->GetGlobalPropertyAsBool(wid)) {
        this->CMakeInstance->GetState()->SetGlobalProperty(wid, "1");
        std::ostringstream w;
        /* clang-format off */
        w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0008) << "\n"
          << "Target \"" << this->Target->GetName() << "\" links to item\n"
          << "  " << item << "\n"
          << "which is a full-path but not a valid library file name.";
        /* clang-format on */
        this->CMakeInstance->IssueMessage(MessageType::AUTHOR_WARNING, w.str(),
                                          this->Target->GetBacktrace());
      }
    }
    case cmPolicies::OLD:
      // OLD behavior does not warn.
      break;
    case cmPolicies::NEW:
      // NEW behavior will not get here.
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS: {
      std::ostringstream e;
      /* clang-format off */
      e << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0008) << "\n"
          << "Target \"" << this->Target->GetName() << "\" links to item\n"
          << "  " << item << "\n"
          << "which is a full-path but not a valid library file name.";
      /* clang-format on */
      this->CMakeInstance->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                        this->Target->GetBacktrace());
    } break;
  }
}